

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O1

void __thiscall cmXMLWriter::EndElement(cmXMLWriter *this)

{
  pointer pbVar1;
  pointer pcVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  undefined8 uStack_18;
  
  if (this->Indent != 0) {
    this->Indent = this->Indent - 1;
    uStack_18 = in_RAX;
    if (this->ElementOpen == true) {
      poVar3 = this->Output;
      pcVar5 = "/>";
      lVar4 = 2;
    }
    else {
      ConditionalLineBreak(this,(bool)(this->IsContent ^ 1));
      this->IsContent = false;
      poVar3 = this->Output;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</",2);
      pbVar1 = (this->Elements).c.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,pbVar1[-1]._M_dataplus._M_p,pbVar1[-1]._M_string_length);
      pcVar5 = (char *)((long)&uStack_18 + 7);
      uStack_18 = CONCAT17(0x3e,(undefined7)uStack_18);
      lVar4 = 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
    pbVar1 = (this->Elements).c.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this->Elements).c.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
    pcVar2 = pbVar1[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &pbVar1[-1].field_2) {
      operator_delete(pcVar2,pbVar1[-1].field_2._M_allocated_capacity + 1);
    }
    this->ElementOpen = false;
    return;
  }
  __assert_fail("this->Indent > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmXMLWriter.cxx"
                ,0x30,"void cmXMLWriter::EndElement()");
}

Assistant:

void cmXMLWriter::EndElement()
{
  assert(this->Indent > 0);
  --this->Indent;
  if (this->ElementOpen) {
    this->Output << "/>";
  } else {
    this->ConditionalLineBreak(!this->IsContent);
    this->IsContent = false;
    this->Output << "</" << this->Elements.top() << '>';
  }
  this->Elements.pop();
  this->ElementOpen = false;
}